

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O0

int __thiscall asl::TabularDataFile::init(TabularDataFile *this,EVP_PKEY_CTX *ctx)

{
  String local_28;
  TabularDataFile *local_10;
  TabularDataFile *this_local;
  
  this->_dataStarted = false;
  this->_separator = ',';
  this->_decimal = '.';
  this->_quote = '\"';
  local_10 = this;
  asl::String::repeat(&local_28,this->_quote,2);
  asl::String::operator=(&this->_equote,&local_28);
  asl::String::~String(&local_28);
  this->_flushEvery = 0;
  this->_rowIndex = 0;
  this->_quoteStrings = false;
  return (int)this;
}

Assistant:

void TabularDataFile::init()
{
	_dataStarted = false;
	_separator = ',';
	_decimal = '.';
	_quote = '\"';
	_equote = String::repeat(_quote, 2);
	_flushEvery = 0;
	_rowIndex = 0;
	_quoteStrings = false;
}